

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_tree_visitor.cpp
# Opt level: O3

void __thiscall ir_tree_visitor::visit(ir_tree_visitor *this,AndExpr *ptr)

{
  SubtreeWrapper *first;
  SubtreeWrapper *second;
  AndConditionalWrapper *this_00;
  
  (**(ptr->first->super_Base)._vptr_Base)(ptr->first,this);
  first = this->curr_wrapper;
  (**(ptr->second->super_Base)._vptr_Base)(ptr->second,this);
  second = this->curr_wrapper;
  this_00 = (AndConditionalWrapper *)operator_new(0x18);
  IRT::AndConditionalWrapper::AndConditionalWrapper(this_00,first,second);
  this->curr_wrapper = (SubtreeWrapper *)this_00;
  return;
}

Assistant:

void ir_tree_visitor::visit(AndExpr* ptr) {
    ptr->first->accept(this);
    auto first = curr_wrapper;
    ptr->second->accept(this);
    auto second = curr_wrapper;

    curr_wrapper = new IRT::AndConditionalWrapper(
        first,
        second
    );
}